

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * __thiscall capnp::_::WirePointer::farTarget(WirePointer *this,SegmentReader *segment)

{
  undefined8 this_00;
  bool bVar1;
  uint uVar2;
  word *pwVar3;
  Fault local_50;
  Fault f;
  Kind local_40;
  DebugExpression<capnp::_::WirePointer::Kind> local_3c;
  undefined1 local_38 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  SegmentReader *segment_local;
  WirePointer *this_local;
  
  _kjCondition._24_8_ = segment;
  local_40 = kind(this);
  local_3c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_40);
  f.exception._4_4_ = 2;
  kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
            ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_38,
             &local_3c,(Kind *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  this_00 = _kjCondition._24_8_;
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd2,FAILED,"kind() == FAR",
               "_kjCondition,\"farTarget() should only be called on FAR pointers.\"",
               (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_38
               ,(char (*) [51])"farTarget() should only be called on FAR pointers.");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  pwVar3 = SegmentReader::getStartPtr((SegmentReader *)_kjCondition._24_8_);
  uVar2 = DirectWireValue<unsigned_int>::get(&this->offsetAndKind);
  pwVar3 = SegmentReader::checkOffset((SegmentReader *)this_00,pwVar3,(ulong)(uVar2 >> 3));
  return pwVar3;
}

Assistant:

KJ_ALWAYS_INLINE(const word* farTarget(SegmentReader* segment) const) {
    KJ_DREQUIRE(kind() == FAR,
        "farTarget() should only be called on FAR pointers.");
    return segment->checkOffset(segment->getStartPtr(), offsetAndKind.get() >> 3);
  }